

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<VkSpecParser::Command>::clear(QList<VkSpecParser::Command> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<VkSpecParser::Command> *this_00;
  __off_t __length;
  QArrayDataPointer<VkSpecParser::Command> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<VkSpecParser::Command> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  qsizetype alloc;
  QArrayDataPointer<VkSpecParser::Command> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<VkSpecParser::Command> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<VkSpecParser::Command>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<VkSpecParser::Command>::needsDetach(in_RDI);
    if (bVar2) {
      qVar3 = -0x5555555555555556;
      alloc = -0x5555555555555556;
      pQVar4 = (QArrayDataPointer<VkSpecParser::Command> *)0xaaaaaaaaaaaaaaaa;
      QArrayDataPointer<VkSpecParser::Command>::allocatedCapacity(in_RDI);
      QArrayDataPointer<VkSpecParser::Command>::QArrayDataPointer(pQVar4,alloc,qVar3,option);
      QArrayDataPointer<VkSpecParser::Command>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<VkSpecParser::Command>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<VkSpecParser::Command> *)
                QArrayDataPointer<VkSpecParser::Command>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<VkSpecParser::Command>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }